

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

string * chaiscript::Boxed_Number::to_string_aux<long_double>
                   (string *__return_storage_ptr__,Boxed_Value *v)

{
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<long_double>
            (*((v->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->m_const_data_ptr);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string_aux(const Boxed_Value &v)
        {
          std::ostringstream oss;
          oss << *static_cast<const Source *>(v.get_const_ptr());
          return oss.str();
        }